

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_fastpfor.cpp
# Opt level: O0

void __thiscall
FastPForLib::FastPForTest_fastpack_0_except_32_Test::~FastPForTest_fastpack_0_except_32_Test
          (FastPForTest_fastpack_0_except_32_Test *this)

{
  void *in_RDI;
  
  ~FastPForTest_fastpack_0_except_32_Test((FastPForTest_fastpack_0_except_32_Test *)0x12ed88);
  operator_delete(in_RDI,0x80);
  return;
}

Assistant:

TEST_P(FastPForTest, fastpack_0_except_32) {
    _genDataWithFixBits64(in64, 32, 256);
    for (int i = 20; i < 40; ++i) {
      in64[i] = 0;
    }
    for (int i = 155; i < 195; i += 2) {
      in64[i] = 0;
    }
    _verify64();
  }